

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall rpc_tests::rpc_ban::test_method(rpc_ban *this)

{
  pointer pcVar1;
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  string args_04;
  string args_05;
  string args_06;
  string args_07;
  string args_08;
  string args_09;
  string args_10;
  string args_11;
  string args_12;
  string args_13;
  string args_14;
  string args_15;
  string args_16;
  string args_17;
  string args_18;
  string args_19;
  string args_20;
  string args_21;
  string args_22;
  string args_23;
  string args_24;
  string args_25;
  int iVar2;
  UniValue *pUVar3;
  string *psVar4;
  long lVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  string_view key;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  string_view key_00;
  string_view key_01;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  string_view key_07;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  string_view key_08;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  string_view key_09;
  const_string file_42;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  undefined4 in_stack_ffffffffffffeb28;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffeb2c;
  undefined4 uVar9;
  check_type cVar13;
  char *pcVar10;
  undefined8 in_stack_ffffffffffffeb38;
  undefined1 *puVar11;
  undefined8 in_stack_ffffffffffffeb40;
  char *pcVar12;
  undefined1 *local_14a0;
  undefined1 *local_1498;
  char *local_1490;
  char *local_1488;
  char *local_1450;
  char *local_1448;
  undefined1 *local_1440;
  undefined1 *local_1438;
  char *local_1430;
  char *local_1428;
  char *local_13f0;
  char *local_13e8;
  undefined1 *local_13e0;
  undefined1 *local_13d8;
  char *local_13d0;
  char *local_13c8;
  char *local_1390;
  char *local_1388;
  undefined1 *local_1380;
  undefined1 *local_1378;
  char *local_1370;
  char *local_1368;
  undefined1 *local_1360;
  undefined1 *local_1358;
  char *local_1350;
  char *local_1348;
  char *local_1310;
  char *local_1308;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12b0;
  char *local_12a8;
  undefined1 *local_12a0;
  undefined1 *local_1298;
  char *local_1290;
  char *local_1288;
  char *local_1250;
  char *local_1248;
  undefined1 *local_1240;
  undefined1 *local_1238;
  char *local_1230;
  char *local_1228;
  undefined1 *local_1220;
  undefined1 *local_1218;
  char *local_1210;
  char *local_1208;
  char *local_11d0;
  char *local_11c8;
  undefined1 *local_11c0;
  undefined1 *local_11b8;
  char *local_11b0;
  char *local_11a8;
  char *local_1170;
  char *local_1168;
  undefined1 *local_1160;
  undefined1 *local_1158;
  char *local_1150;
  char *local_1148;
  char *local_1110;
  char *local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  char *local_10f0;
  char *local_10e8;
  undefined1 *local_10e0;
  undefined1 *local_10d8;
  char *local_10d0;
  char *local_10c8;
  undefined1 *local_10c0;
  undefined1 *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_1070;
  char *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  char *local_1050;
  char *local_1048;
  undefined8 local_1030;
  char *local_1010;
  char *local_1008;
  undefined1 *local_1000;
  undefined1 *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fb0;
  char *local_fa8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  char *local_f90;
  char *local_f88;
  undefined1 *local_f80;
  undefined1 *local_f78;
  char *local_f70;
  char *local_f68;
  char *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  char *local_f10;
  char *local_f08;
  undefined4 local_efc;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ea8;
  char *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e48;
  char *local_e40;
  undefined1 *local_e38;
  undefined1 *local_e30;
  char *local_e28;
  char *local_e20;
  char *local_de8;
  char *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  char *local_dc8;
  char *local_dc0;
  undefined1 *local_db8;
  undefined1 *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  undefined1 local_d58 [24];
  char *local_d40;
  char *local_d38;
  undefined1 *local_d30;
  undefined1 *local_d28;
  char *local_d20;
  char *local_d18;
  int64_t time_remaining;
  int64_t ban_duration;
  char *local_cd0;
  char *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_c70;
  char *local_c68;
  undefined1 *local_c60;
  undefined1 *local_c58;
  char *local_c50;
  char *local_c48;
  char *local_c10;
  char *local_c08;
  undefined1 *local_c00;
  undefined1 *local_bf8;
  char *local_bf0;
  char *local_be8;
  int64_t time_remaining_expected;
  undefined1 *local_bd8;
  undefined1 *local_bd0;
  char *local_bc8;
  char *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b68;
  char *local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  int64_t banned_until;
  undefined1 *local_ad0;
  undefined1 local_ac8 [8];
  char *local_ac0;
  char *local_ab8;
  char *local_a80;
  char *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  lazy_ostream local_9f0;
  undefined1 *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  int64_t *local_810;
  assertion_result local_808;
  int64_t **local_7f0;
  string *local_7e8;
  char *local_7e0;
  char *local_7d8;
  assertion_result local_7d0;
  long *local_7b8 [2];
  long local_7a8 [2];
  long *local_798 [2];
  long local_788 [2];
  long *local_778 [2];
  long local_768 [2];
  UniValue local_758;
  long *local_700 [2];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  UniValue local_6a0;
  long *local_648 [2];
  long local_638 [2];
  long *local_628 [2];
  long local_618 [2];
  long *local_608 [2];
  long local_5f8 [2];
  long *local_5e8 [2];
  long local_5d8 [2];
  long *local_5c8 [2];
  long local_5b8 [2];
  UniValue local_5a8;
  long *local_550 [2];
  long local_540 [2];
  long *local_530 [2];
  long local_520 [2];
  long *local_510 [2];
  long local_500 [2];
  long *local_4f0 [2];
  long local_4e0 [2];
  UniValue local_4d0;
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  long *local_418 [2];
  long local_408 [2];
  UniValue local_3f8;
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  undefined1 local_340 [8];
  bool local_338 [8];
  undefined1 *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<UniValue,_std::allocator<UniValue>_> local_300;
  long *local_2e8 [2];
  long local_2d8 [2];
  UniValue local_2c8;
  UniValue adr;
  UniValue o1;
  long *local_1c0 [2];
  long local_1b0 [2];
  long *local_1a0 [2];
  long local_190 [2];
  long *local_180 [2];
  long local_170 [2];
  UniValue ar;
  undefined1 local_108 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_c8;
  long *local_b0 [2];
  long local_a0 [2];
  UniValue local_90;
  long local_38;
  
  local_1030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"clearbanned","");
  args._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeb2c;
  args._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeb28;
  args._M_string_length = (size_type)_cVar13;
  args.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  args.field_2._8_8_ = in_stack_ffffffffffffeb40;
  RPCTestingSetup::CallRPC(&local_90,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x13c;
  file.m_begin = (iterator)&local_820;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_830,msg);
  ar.typ._0_1_ = 1;
  ar.val._M_dataplus._M_p = (pointer)0x0;
  ar.val._M_string_length = 0;
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_013d73d0;
  local_108._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0._M_allocated_capacity = 0xeed8c5;
  local_840 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_838 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ar,(lazy_ostream *)local_108,1,1,WARN,_cVar13,(size_t)&local_840,
             0x13c);
  boost::detail::shared_count::~shared_count((shared_count *)&ar.val._M_string_length);
  local_108._8_8_ = &local_f0;
  local_108._16_8_ = 0;
  local_f0._M_allocated_capacity = local_f0._M_allocated_capacity & 0xffffffffffffff00;
  local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"setban 127.0.0.0 add","");
  args_00._M_dataplus._M_p._4_4_ = uVar9;
  args_00._M_dataplus._M_p._0_4_ = uVar8;
  args_00._M_string_length = (size_type)_cVar13;
  args_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  args_00.field_2._8_8_ = in_stack_ffffffffffffeb40;
  RPCTestingSetup::CallRPC(&ar,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  local_108._0_4_ = ar.typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             &ar.val);
  o1.val._M_string_length =
       (size_type)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  o1.val._M_dataplus._M_p =
       (pointer)local_e0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  o1._0_8_ = local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&o1);
  o1.val._M_string_length =
       (size_type)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  o1.val._M_dataplus._M_p =
       (pointer)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  o1._0_8_ = vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&o1);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&ar.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ar.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ar.val._M_dataplus._M_p != &ar.val.field_2) {
    operator_delete(ar.val._M_dataplus._M_p,ar.val.field_2._M_allocated_capacity + 1);
  }
  if (local_180[0] != local_170) {
    operator_delete(local_180[0],local_170[0] + 1);
  }
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x13f;
  file_00.m_begin = (iterator)&local_880;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_890,
             msg_00);
  o1.typ._0_1_ = 1;
  o1.val._M_dataplus._M_p = (pointer)0x0;
  o1.val._M_string_length = 0;
  ar.val._M_dataplus._M_p = ar.val._M_dataplus._M_p & 0xffffffffffffff00;
  ar._0_8_ = &PTR__lazy_ostream_013d4ee0;
  ar.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  ar.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_135f6c7;
  local_8a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_898 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&o1,(lazy_ostream *)&ar,1,1,WARN,_cVar13,(size_t)&local_8a0,0x13f);
  boost::detail::shared_count::~shared_count((shared_count *)&o1.val._M_string_length);
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x140;
  file_01.m_begin = (iterator)&local_8e0;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_8f0,
             msg_01);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"setban 127.0.0.0:8334","");
  args_01._M_dataplus._M_p._4_4_ = uVar9;
  args_01._M_dataplus._M_p._0_4_ = uVar8;
  args_01._M_string_length = (size_type)_cVar13;
  args_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  args_01.field_2._8_8_ = in_stack_ffffffffffffeb40;
  RPCTestingSetup::CallRPC(&ar,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  local_108._0_4_ = ar.typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             &ar.val);
  o1.val._M_string_length =
       (size_type)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  o1.val._M_dataplus._M_p =
       (pointer)local_e0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  o1._0_8_ = local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&o1);
  o1.val._M_string_length =
       (size_type)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  o1.val._M_dataplus._M_p =
       (pointer)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  o1._0_8_ = vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&o1);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&ar.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ar.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ar.val._M_dataplus._M_p != &ar.val.field_2) {
    operator_delete(ar.val._M_dataplus._M_p,ar.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  local_900 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_8f8 = "";
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x140;
  file_02.m_begin = (iterator)&local_900;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_910,
             msg_02);
  o1._0_8_ = o1._0_8_ & 0xffffffffffffff00;
  o1.val._M_dataplus._M_p = (pointer)0x0;
  o1.val._M_string_length = 0;
  ar.val._M_dataplus._M_p = ar.val._M_dataplus._M_p & 0xffffffffffffff00;
  ar._0_8_ = &PTR__lazy_ostream_013d45f0;
  ar.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  ar.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_28e313;
  local_920 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_918 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&o1,(lazy_ostream *)&ar,1,1,WARN,_cVar13,(size_t)&local_920,0x140);
  boost::detail::shared_count::~shared_count((shared_count *)&o1.val._M_string_length);
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"listbanned","");
  args_02._M_dataplus._M_p._4_4_ = uVar9;
  args_02._M_dataplus._M_p._0_4_ = uVar8;
  args_02._M_string_length = (size_type)_cVar13;
  args_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeb38;
  args_02.field_2._8_8_ = in_stack_ffffffffffffeb40;
  RPCTestingSetup::CallRPC(&ar,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  local_108._0_4_ = ar.typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             &ar.val);
  o1.val._M_string_length =
       (size_type)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  o1.val._M_dataplus._M_p =
       (pointer)local_e0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  o1._0_8_ = local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       ar.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ar.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&o1);
  o1.val._M_string_length =
       (size_type)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  o1.val._M_dataplus._M_p =
       (pointer)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  o1._0_8_ = vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&o1);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&ar.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ar.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ar.val._M_dataplus._M_p != &ar.val.field_2) {
    operator_delete(ar.val._M_dataplus._M_p,ar.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  local_960 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x141;
  file_03.m_begin = (iterator)&local_960;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_970,
             msg_03);
  o1.typ._0_1_ = 1;
  o1.val._M_dataplus._M_p = (pointer)0x0;
  o1.val._M_string_length = 0;
  ar.val._M_dataplus._M_p = ar.val._M_dataplus._M_p & 0xffffffffffffff00;
  ar._0_8_ = &PTR__lazy_ostream_013d4ea0;
  ar.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  ar.val.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_135f709;
  local_980 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_978 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&o1,(lazy_ostream *)&ar,1,1,WARN,_cVar13,(size_t)&local_980,0x141);
  boost::detail::shared_count::~shared_count((shared_count *)&o1.val._M_string_length);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  ar.val._M_dataplus._M_p = (pointer)&ar.val.field_2;
  pcVar1 = (pUVar3->val)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ar.val,pcVar1,pcVar1 + (pUVar3->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&ar.values,&pUVar3->values);
  pUVar3 = ::UniValue::operator[](&ar,0);
  pUVar3 = ::UniValue::get_obj(pUVar3);
  o1.typ = pUVar3->typ;
  o1.val._M_dataplus._M_p = (pointer)&o1.val.field_2;
  pcVar1 = (pUVar3->val)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&o1.val,pcVar1,pcVar1 + (pUVar3->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&o1.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&o1.values,&pUVar3->values);
  key._M_str = "address";
  key._M_len = 7;
  pUVar3 = ::UniValue::find_value(&o1,key);
  adr.typ = pUVar3->typ;
  adr.val._M_dataplus._M_p = (pointer)&adr.val.field_2;
  pcVar1 = (pUVar3->val)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&adr.val,pcVar1,pcVar1 + (pUVar3->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&adr.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&adr.values,&pUVar3->values);
  local_9c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9b8 = "";
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x145;
  file_04.m_begin = (iterator)&local_9c0;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_9d0,
             msg_04);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  psVar4 = ::UniValue::get_str_abi_cxx11_(&adr);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"127.0.0.0/32");
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  puVar11 = local_340;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  local_810 = (int64_t *)0xeedaa6;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d3eb0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar12 = "\"127.0.0.0/32\"";
  pcVar10 = "adr.get_str()";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_7e8 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeeda98,(size_t)&local_7e0,0x145,puVar11,
             "\"127.0.0.0/32\"",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"setban 127.0.0.0 remove","");
  args_03._M_dataplus._M_p._4_4_ = uVar9;
  args_03._M_dataplus._M_p._0_4_ = uVar8;
  args_03._M_string_length = (size_type)pcVar10;
  args_03.field_2._M_allocated_capacity = (size_type)puVar11;
  args_03.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC(&local_2c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2c8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.val._M_dataplus._M_p != &local_2c8.val.field_2) {
    operator_delete(local_2c8.val._M_dataplus._M_p,local_2c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  local_a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x146;
  file_05.m_begin = (iterator)&local_a00;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_a10,
             msg_05);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d7490;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeedada;
  local_a20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a18 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_a20,
             0x146);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"listbanned","");
  args_04._M_dataplus._M_p._4_4_ = uVar9;
  args_04._M_dataplus._M_p._0_4_ = uVar8;
  args_04._M_string_length = (size_type)pcVar10;
  args_04.field_2._M_allocated_capacity = (size_type)puVar11;
  args_04.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_04);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  local_a60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a58 = "";
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x147;
  file_06.m_begin = (iterator)&local_a60;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_a70,
             msg_06);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_a80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a78 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_a80,
             0x147);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  local_ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ab8 = "";
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac8 = (undefined1  [8])&boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x149;
  file_07.m_begin = (iterator)&local_ac0;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_ad0,
             msg_07);
  banned_until = ((long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish ==
       ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  local_7e8 = (string *)&banned_until;
  local_810 = &time_remaining_expected;
  time_remaining_expected = (ulong)time_remaining_expected._4_4_ << 0x20;
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "0U";
  puVar11 = local_340;
  pcVar10 = "ar.size()";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedb71,(size_t)&local_7e0,0x149,puVar11,"0U",
             &local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,"setban 127.0.0.0/24 add 9907731200 true","");
  args_05._M_dataplus._M_p._4_4_ = uVar9;
  args_05._M_dataplus._M_p._0_4_ = uVar8;
  args_05._M_string_length = (size_type)pcVar10;
  args_05.field_2._M_allocated_capacity = (size_type)puVar11;
  args_05.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_05);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    local_328._M_allocated_capacity + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  local_ae8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x14b;
  file_08.m_begin = (iterator)&local_ae8;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_af8,
             msg_08);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d7510;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeedba3;
  local_b08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b00 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_b08,
             0x14b);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"listbanned","");
  args_06._M_dataplus._M_p._4_4_ = uVar9;
  args_06._M_dataplus._M_p._0_4_ = uVar8;
  args_06._M_string_length = (size_type)pcVar10;
  args_06.field_2._M_allocated_capacity = (size_type)puVar11;
  args_06.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_06);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  local_b48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b40 = "";
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x14c;
  file_09.m_begin = (iterator)&local_b48;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_b58,
             msg_09);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_b68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b60 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_b68,
             0x14c);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  pUVar3 = ::UniValue::operator[](&ar,0);
  pUVar3 = ::UniValue::get_obj(pUVar3);
  o1.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&o1.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o1.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&o1.values,&pUVar3->values);
  key_00._M_str = "address";
  key_00._M_len = 7;
  pUVar3 = ::UniValue::find_value(&o1,key_00);
  adr.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&adr.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&adr.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&adr.values,&pUVar3->values);
  key_01._M_str = "banned_until";
  key_01._M_len = 0xc;
  pUVar3 = ::UniValue::find_value(&o1,key_01);
  banned_until = ::UniValue::getInt<long>(pUVar3);
  local_ba8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ba0 = "";
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x151;
  file_10.m_begin = (iterator)&local_ba8;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_bb8,
             msg_10);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  psVar4 = ::UniValue::get_str_abi_cxx11_(&adr);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"127.0.0.0/24");
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = (int64_t *)0xeedc6f;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d3eb0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_7e8 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeeda98,(size_t)&local_7e0,0x151,local_340,
             "\"127.0.0.0/24\"",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_bc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_bc0 = "";
  local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x152;
  file_11.m_begin = (iterator)&local_bc8;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_bd8,
             msg_11);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  time_remaining_expected = 0x24e8bfb00;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(banned_until == 0x24e8bfb00);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_7e8 = (string *)&banned_until;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4050;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = &time_remaining_expected;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d4050;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "9907731200";
  puVar11 = local_340;
  pcVar10 = "banned_until";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedc62,(size_t)&local_7e0,0x152,puVar11,
             "9907731200",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"clearbanned","");
  args_07._M_dataplus._M_p._4_4_ = uVar9;
  args_07._M_dataplus._M_p._0_4_ = uVar8;
  args_07._M_string_length = (size_type)pcVar10;
  args_07.field_2._M_allocated_capacity = (size_type)puVar11;
  args_07.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC(&local_3f8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_07);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.val._M_dataplus._M_p != &local_3f8.val.field_2) {
    operator_delete(local_3f8.val._M_dataplus._M_p,local_3f8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  local_bf0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_be8 = "";
  local_c00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x154;
  file_12.m_begin = (iterator)&local_bf0;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_c00,
             msg_12);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d73d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeed8c5;
  local_c10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c08 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_c10,
             0x154);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  SetMockTime((seconds)0x2710);
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,"setban 127.0.0.0/24 add 200","");
  args_08._M_dataplus._M_p._4_4_ = uVar9;
  args_08._M_dataplus._M_p._0_4_ = uVar8;
  args_08._M_string_length = (size_type)pcVar10;
  args_08.field_2._M_allocated_capacity = (size_type)puVar11;
  args_08.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_08);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  local_c50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c48 = "";
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x158;
  file_13.m_begin = (iterator)&local_c50;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_c60,
             msg_13);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d6fd0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeedcb2;
  local_c70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c68 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_c70,
             0x158);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  SetMockTime((seconds)0x2712);
  time_remaining_expected = 0xc6;
  local_458[0] = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"listbanned","");
  args_09._M_dataplus._M_p._4_4_ = uVar9;
  args_09._M_dataplus._M_p._0_4_ = uVar8;
  args_09._M_string_length = (size_type)pcVar10;
  args_09.field_2._M_allocated_capacity = (size_type)puVar11;
  args_09.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_09);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_458[0] != local_448) {
    operator_delete(local_458[0],local_448[0] + 1);
  }
  local_cb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ca8 = "";
  local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x15b;
  file_14.m_begin = (iterator)&local_cb0;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_cc0,
             msg_14);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_cd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_cc8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_cd0,
             0x15b);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  pUVar3 = ::UniValue::operator[](&ar,0);
  pUVar3 = ::UniValue::get_obj(pUVar3);
  o1.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&o1.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o1.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&o1.values,&pUVar3->values);
  key_02._M_str = "address";
  key_02._M_len = 7;
  pUVar3 = ::UniValue::find_value(&o1,key_02);
  adr.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&adr.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&adr.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&adr.values,&pUVar3->values);
  key_03._M_str = "banned_until";
  key_03._M_len = 0xc;
  pUVar3 = ::UniValue::find_value(&o1,key_03);
  banned_until = ::UniValue::getInt<long>(pUVar3);
  key_04._M_str = "ban_created";
  key_04._M_len = 0xb;
  pUVar3 = ::UniValue::find_value(&o1,key_04);
  lVar5 = ::UniValue::getInt<long>(pUVar3);
  key_05._M_str = "ban_duration";
  key_05._M_len = 0xc;
  pUVar3 = ::UniValue::find_value(&o1,key_05);
  ban_duration = ::UniValue::getInt<long>(pUVar3);
  key_06._M_str = "time_remaining";
  key_06._M_len = 0xe;
  pUVar3 = ::UniValue::find_value(&o1,key_06);
  time_remaining = ::UniValue::getInt<long>(pUVar3);
  local_d20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d18 = "";
  local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x163;
  file_15.m_begin = (iterator)&local_d20;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_d30,
             msg_15);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  psVar4 = ::UniValue::get_str_abi_cxx11_(&adr);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"127.0.0.0/24");
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = (int64_t *)0xeedc6f;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d3eb0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_7e8 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeeda98,(size_t)&local_7e0,0x163,local_340,
             "\"127.0.0.0/24\"",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_d40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d38 = "";
  local_d58._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_d58._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x164;
  file_16.m_begin = (iterator)&local_d40;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)(local_d58 + 8),
             msg_16);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  local_810 = (int64_t *)local_d58;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(banned_until == 0x27d8);
  local_d58._0_8_ = (pointer)0x27d8;
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_7e8 = (string *)&banned_until;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4050;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d4050;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedc62,(size_t)&local_7e0,0x164,local_340,
             "time_remaining_expected + now.count()",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_d68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d60 = "";
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x165;
  file_17.m_begin = (iterator)&local_d68;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_d78,
             msg_17);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  local_d58._0_8_ = banned_until - lVar5;
  local_7e8 = (string *)&ban_duration;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ban_duration == local_d58._0_8_);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4050;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = (int64_t *)local_d58;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d4050;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedd59,(size_t)&local_7e0,0x165,local_340,
             "banned_until - ban_created",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_d88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d80 = "";
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x166;
  file_18.m_begin = (iterator)&local_d88;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_d98,
             msg_18);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_7e8 = (string *)&time_remaining;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(time_remaining == time_remaining_expected);
  local_9d8 = "";
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4050;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = &time_remaining_expected;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d4050;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "time_remaining_expected";
  puVar11 = local_340;
  pcVar10 = "time_remaining";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedd66,(size_t)&local_7e0,0x166,puVar11,
             "time_remaining_expected",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_da8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_da0 = "";
  local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x169;
  file_19.m_begin = (iterator)&local_da8;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_db8,
             msg_19);
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"setban 127.0.0.1 add","");
  args_10._M_dataplus._M_p._4_4_ = uVar9;
  args_10._M_dataplus._M_p._0_4_ = uVar8;
  args_10._M_string_length = (size_type)pcVar10;
  args_10.field_2._M_allocated_capacity = (size_type)puVar11;
  args_10.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_10);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    local_328._M_allocated_capacity + 1);
  }
  if (local_478[0] != local_468) {
    operator_delete(local_478[0],local_468[0] + 1);
  }
  local_dc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_dc0 = "";
  local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x169;
  file_20.m_begin = (iterator)&local_dc8;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_dd8,
             msg_20);
  local_808._0_8_ = local_808._0_8_ & 0xffffffffffffff00;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d45f0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xe840f0;
  local_de8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_de0 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_de8,
             0x169);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,"setban 127.0.0.0/24 remove","");
  args_11._M_dataplus._M_p._4_4_ = uVar9;
  args_11._M_dataplus._M_p._0_4_ = uVar8;
  args_11._M_string_length = (size_type)pcVar10;
  args_11.field_2._M_allocated_capacity = (size_type)puVar11;
  args_11.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC(&local_4d0,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_11);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4d0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.val._M_dataplus._M_p != &local_4d0.val.field_2) {
    operator_delete(local_4d0.val._M_dataplus._M_p,local_4d0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  local_e28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e20 = "";
  local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x16b;
  file_21.m_begin = (iterator)&local_e28;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_e38,
             msg_21);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d7590;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeddfe;
  local_e48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e40 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_e48,
             0x16b);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"listbanned","");
  args_12._M_dataplus._M_p._4_4_ = uVar9;
  args_12._M_dataplus._M_p._0_4_ = uVar8;
  args_12._M_string_length = (size_type)pcVar10;
  args_12.field_2._M_allocated_capacity = (size_type)puVar11;
  args_12.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_12);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_510[0] != local_500) {
    operator_delete(local_510[0],local_500[0] + 1);
  }
  local_e88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e80 = "";
  local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x16c;
  file_22.m_begin = (iterator)&local_e88;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_e98,
             msg_22);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_ea8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ea0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_ea8,
             0x16c);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  local_ee8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ee0 = "";
  local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x16e;
  file_23.m_begin = (iterator)&local_ee8;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_ef8,
             msg_23);
  local_d58._0_8_ =
       ((long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish ==
       ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  local_efc = 0;
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_7e8 = (string *)local_d58;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_808._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "0U";
  puVar11 = local_340;
  pcVar10 = "ar.size()";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_810 = (int64_t *)&local_efc;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedb71,(size_t)&local_7e0,0x16e,puVar11,"0U",
             &local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_530[0] = local_520;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_530,"setban 127.0.0.0/255.255.0.0 add","");
  args_13._M_dataplus._M_p._4_4_ = uVar9;
  args_13._M_dataplus._M_p._0_4_ = uVar8;
  args_13._M_string_length = (size_type)pcVar10;
  args_13.field_2._M_allocated_capacity = (size_type)puVar11;
  args_13.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_13);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    local_328._M_allocated_capacity + 1);
  }
  if (local_530[0] != local_520) {
    operator_delete(local_530[0],local_520[0] + 1);
  }
  local_f10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f08 = "";
  local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x170;
  file_24.m_begin = (iterator)&local_f10;
  msg_24.m_end = pvVar7;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_f20,
             msg_24);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d7610;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeedebc;
  local_f30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f28 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_f30,
             0x170);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_f70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f68 = "";
  local_f80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x171;
  file_25.m_begin = (iterator)&local_f70;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_f80,
             msg_25);
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"setban 127.0.1.1 add","");
  args_14._M_dataplus._M_p._4_4_ = uVar9;
  args_14._M_dataplus._M_p._0_4_ = uVar8;
  args_14._M_string_length = (size_type)pcVar10;
  args_14.field_2._M_allocated_capacity = (size_type)puVar11;
  args_14.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_14);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0],local_540[0] + 1);
  }
  local_f90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f88 = "";
  local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x171;
  file_26.m_begin = (iterator)&local_f90;
  msg_26.m_end = pvVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_fa0,
             msg_26);
  local_808._0_8_ = local_808._0_8_ & 0xffffffffffffff00;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d45f0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xe840f0;
  local_fb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fa8 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_fb0,
             0x171);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"clearbanned","");
  args_15._M_dataplus._M_p._4_4_ = uVar9;
  args_15._M_dataplus._M_p._0_4_ = uVar8;
  args_15._M_string_length = (size_type)pcVar10;
  args_15.field_2._M_allocated_capacity = (size_type)puVar11;
  args_15.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC(&local_5a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_15);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5a8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5a8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.val._M_dataplus._M_p != &local_5a8.val.field_2) {
    operator_delete(local_5a8.val._M_dataplus._M_p,local_5a8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0],local_5b8[0] + 1);
  }
  local_ff0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fe8 = "";
  local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ff8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x173;
  file_27.m_begin = (iterator)&local_ff0;
  msg_27.m_end = pvVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1000,
             msg_27);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d73d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeed8c5;
  local_1010 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1008 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1010,
             0x173);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"listbanned","");
  args_16._M_dataplus._M_p._4_4_ = uVar9;
  args_16._M_dataplus._M_p._0_4_ = uVar8;
  args_16._M_string_length = (size_type)pcVar10;
  args_16.field_2._M_allocated_capacity = (size_type)puVar11;
  args_16.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_16);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_5e8[0] != local_5d8) {
    operator_delete(local_5e8[0],local_5d8[0] + 1);
  }
  local_1050 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1048 = "";
  local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x174;
  file_28.m_begin = (iterator)&local_1050;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1060,
             msg_28);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_1070 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1068 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1070,
             0x174);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  local_10b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10a8 = "";
  local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x176;
  file_29.m_begin = (iterator)&local_10b0;
  msg_29.m_end = pvVar7;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_10c0,
             msg_29);
  local_d58._0_8_ =
       ((long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish ==
       ar.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  local_efc = 0;
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_7e8 = (string *)local_d58;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3cf0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "0U";
  puVar11 = local_340;
  pcVar10 = "ar.size()";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_810 = (int64_t *)&local_efc;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeedb71,(size_t)&local_7e0,0x176,puVar11,"0U",
             &local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_10d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10c8 = "";
  local_10e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x179;
  file_30.m_begin = (iterator)&local_10d0;
  msg_30.m_end = pvVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_10e0,
             msg_30);
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"setban test add","");
  args_17._M_dataplus._M_p._4_4_ = uVar9;
  args_17._M_dataplus._M_p._0_4_ = uVar8;
  args_17._M_string_length = (size_type)pcVar10;
  args_17.field_2._M_allocated_capacity = (size_type)puVar11;
  args_17.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_17);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    local_328._M_allocated_capacity + 1);
  }
  if (local_608[0] != local_5f8) {
    operator_delete(local_608[0],local_5f8[0] + 1);
  }
  local_10f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10e8 = "";
  local_1100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x179;
  file_31.m_begin = (iterator)&local_10f0;
  msg_31.m_end = pvVar7;
  msg_31.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_1100,
             msg_31);
  local_808._0_8_ = local_808._0_8_ & 0xffffffffffffff00;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d45f0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xe840f0;
  local_1110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1108 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1110,
             0x179);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_628,"setban FE80:0000:0000:0000:0202:B3FF:FE1E:8329 add","");
  args_18._M_dataplus._M_p._4_4_ = uVar9;
  args_18._M_dataplus._M_p._0_4_ = uVar8;
  args_18._M_string_length = (size_type)pcVar10;
  args_18.field_2._M_allocated_capacity = (size_type)puVar11;
  args_18.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_18);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_628[0] != local_618) {
    operator_delete(local_628[0],local_618[0] + 1);
  }
  local_1150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1148 = "";
  local_1160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x17c;
  file_32.m_begin = (iterator)&local_1150;
  msg_32.m_end = pvVar7;
  msg_32.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_1160,
             msg_32);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d7650;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeedfc5;
  local_1170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1168 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1170,
             0x17c);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"listbanned","");
  args_19._M_dataplus._M_p._4_4_ = uVar9;
  args_19._M_dataplus._M_p._0_4_ = uVar8;
  args_19._M_string_length = (size_type)pcVar10;
  args_19.field_2._M_allocated_capacity = (size_type)puVar11;
  args_19.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_19);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_648[0] != local_638) {
    operator_delete(local_648[0],local_638[0] + 1);
  }
  local_11b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11a8 = "";
  local_11c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x17d;
  file_33.m_begin = (iterator)&local_11b0;
  msg_33.m_end = pvVar7;
  msg_33.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_11c0,
             msg_33);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_11d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11c8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_11d0,
             0x17d);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  pUVar3 = ::UniValue::operator[](&ar,0);
  pUVar3 = ::UniValue::get_obj(pUVar3);
  o1.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&o1.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o1.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&o1.values,&pUVar3->values);
  key_07._M_str = "address";
  key_07._M_len = 7;
  pUVar3 = ::UniValue::find_value(&o1,key_07);
  adr.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&adr.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&adr.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&adr.values,&pUVar3->values);
  local_1210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1208 = "";
  local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x181;
  file_34.m_begin = (iterator)&local_1210;
  msg_34.m_end = pvVar7;
  msg_34.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_1220,
             msg_34);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  psVar4 = ::UniValue::get_str_abi_cxx11_(&adr);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"fe80::202:b3ff:fe1e:8329/128");
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = (int64_t *)0xeee09a;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d76d0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "\"fe80::202:b3ff:fe1e:8329/128\"";
  puVar11 = local_340;
  pcVar10 = "adr.get_str()";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_7e8 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeeda98,(size_t)&local_7e0,0x181,puVar11,
             "\"fe80::202:b3ff:fe1e:8329/128\"",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c0,"clearbanned","");
  args_20._M_dataplus._M_p._4_4_ = uVar9;
  args_20._M_dataplus._M_p._0_4_ = uVar8;
  args_20._M_string_length = (size_type)pcVar10;
  args_20.field_2._M_allocated_capacity = (size_type)puVar11;
  args_20.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC(&local_6a0,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_20);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0.val._M_dataplus._M_p != &local_6a0.val.field_2) {
    operator_delete(local_6a0.val._M_dataplus._M_p,local_6a0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  local_1230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1228 = "";
  local_1240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x183;
  file_35.m_begin = (iterator)&local_1230;
  msg_35.m_end = pvVar7;
  msg_35.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_1240,
             msg_35);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d73d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeed8c5;
  local_1250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1248 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1250,
             0x183);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,"setban 2001:db8::/ffff:fffc:0:0:0:0:0:0 add","");
  args_21._M_dataplus._M_p._4_4_ = uVar9;
  args_21._M_dataplus._M_p._0_4_ = uVar8;
  args_21._M_string_length = (size_type)pcVar10;
  args_21.field_2._M_allocated_capacity = (size_type)puVar11;
  args_21.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_21);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  local_1290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1288 = "";
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x184;
  file_36.m_begin = (iterator)&local_1290;
  msg_36.m_end = pvVar7;
  msg_36.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_12a0,
             msg_36);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d6408;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeee102;
  local_12b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12a8 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_12b0,
             0x184);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"listbanned","");
  args_22._M_dataplus._M_p._4_4_ = uVar9;
  args_22._M_dataplus._M_p._0_4_ = uVar8;
  args_22._M_string_length = (size_type)pcVar10;
  args_22.field_2._M_allocated_capacity = (size_type)puVar11;
  args_22.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_22);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  local_12f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12e8 = "";
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x185;
  file_37.m_begin = (iterator)&local_12f0;
  msg_37.m_end = pvVar7;
  msg_37.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1300,
             msg_37);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_1310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1308 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1310,
             0x185);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  pUVar3 = ::UniValue::operator[](&ar,0);
  pUVar3 = ::UniValue::get_obj(pUVar3);
  o1.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&o1.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o1.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&o1.values,&pUVar3->values);
  key_08._M_str = "address";
  key_08._M_len = 7;
  pUVar3 = ::UniValue::find_value(&o1,key_08);
  adr.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&adr.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&adr.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&adr.values,&pUVar3->values);
  local_1350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1348 = "";
  local_1360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x189;
  file_38.m_begin = (iterator)&local_1350;
  msg_38.m_end = pvVar7;
  msg_38.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_1360,
             msg_38);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  psVar4 = ::UniValue::get_str_abi_cxx11_(&adr);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"2001:db8::/30");
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = (int64_t *)0xeee1c9;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d7290;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  pcVar12 = "\"2001:db8::/30\"";
  puVar11 = local_340;
  pcVar10 = "adr.get_str()";
  uVar8 = 2;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_7e8 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeeda98,(size_t)&local_7e0,0x189,puVar11,
             "\"2001:db8::/30\"",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  local_778[0] = local_768;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_778,"clearbanned","");
  args_23._M_dataplus._M_p._4_4_ = uVar9;
  args_23._M_dataplus._M_p._0_4_ = uVar8;
  args_23._M_string_length = (size_type)pcVar10;
  args_23.field_2._M_allocated_capacity = (size_type)puVar11;
  args_23.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC(&local_758,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_23);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_758.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_758.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758.val._M_dataplus._M_p != &local_758.val.field_2) {
    operator_delete(local_758.val._M_dataplus._M_p,local_758.val.field_2._M_allocated_capacity + 1);
  }
  if (local_778[0] != local_768) {
    operator_delete(local_778[0],local_768[0] + 1);
  }
  local_1370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1368 = "";
  local_1380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x18b;
  file_39.m_begin = (iterator)&local_1370;
  msg_39.m_end = pvVar7;
  msg_39.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_1380,
             msg_39);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d73d0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeed8c5;
  local_1390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1388 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1390,
             0x18b);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_798[0] = local_788;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_798,"setban 2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128 add","");
  args_24._M_dataplus._M_p._4_4_ = uVar9;
  args_24._M_dataplus._M_p._0_4_ = uVar8;
  args_24._M_string_length = (size_type)pcVar10;
  args_24.field_2._M_allocated_capacity = (size_type)puVar11;
  args_24.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_24);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_798[0] != local_788) {
    operator_delete(local_798[0],local_788[0] + 1);
  }
  local_13d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13c8 = "";
  local_13e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_13d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x18c;
  file_40.m_begin = (iterator)&local_13d0;
  msg_40.m_end = pvVar7;
  msg_40.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_13e0,
             msg_40);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d7710;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeee21d;
  local_13f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13e8 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_13f0,
             0x18c);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  local_7b8[0] = local_7a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"listbanned","");
  args_25._M_dataplus._M_p._4_4_ = uVar9;
  args_25._M_dataplus._M_p._0_4_ = uVar8;
  args_25._M_string_length = (size_type)pcVar10;
  args_25.field_2._M_allocated_capacity = (size_type)puVar11;
  args_25.field_2._8_8_ = pcVar12;
  RPCTestingSetup::CallRPC((UniValue *)local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_25);
  local_108._0_4_ = local_340._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_108 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       local_e0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_318.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_808);
  local_808.m_message.pn.pi_ =
       (sp_counted_base *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_808.m_message.px =
       (element_type *)
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_300.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_808);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_338._1_7_,local_338[0]) != &local_328) {
    operator_delete((char **)CONCAT71(local_338._1_7_,local_338[0]),
                    (ulong)(local_328._M_allocated_capacity + 1));
  }
  if (local_7b8[0] != local_7a8) {
    operator_delete(local_7b8[0],local_7a8[0] + 1);
  }
  local_1430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1428 = "";
  local_1440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x18d;
  file_41.m_begin = (iterator)&local_1430;
  msg_41.m_end = pvVar7;
  msg_41.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_1440,
             msg_41);
  local_808.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_808.m_message.px = (element_type *)0x0;
  local_808.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d4ea0;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = 0xeeda13;
  local_1450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1448 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_808,(lazy_ostream *)local_340,1,1,WARN,(check_type)pcVar10,(size_t)&local_1450,
             0x18d);
  boost::detail::shared_count::~shared_count(&local_808.m_message.pn);
  pUVar3 = ::UniValue::get_array((UniValue *)local_108);
  ar.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ar.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&ar.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&ar.values,&pUVar3->values);
  pUVar3 = ::UniValue::operator[](&ar,0);
  pUVar3 = ::UniValue::get_obj(pUVar3);
  o1.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&o1.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o1.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&o1.values,&pUVar3->values);
  key_09._M_str = "address";
  key_09._M_len = 7;
  pUVar3 = ::UniValue::find_value(&o1,key_09);
  adr.typ = pUVar3->typ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&adr.val,&pUVar3->val);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&adr.keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&adr.values,&pUVar3->values);
  local_1490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1488 = "";
  local_14a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x191;
  file_42.m_begin = (iterator)&local_1490;
  msg_42.m_end = pvVar7;
  msg_42.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_14a0,
             msg_42);
  local_9f0.m_empty = false;
  local_9f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_9e0 = boost::unit_test::lazy_ostream::inst;
  local_9d8 = "";
  psVar4 = ::UniValue::get_str_abi_cxx11_(&adr);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar4,"2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128");
  local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_7d0.m_message.px = (element_type *)0x0;
  local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  local_338[0] = false;
  local_340 = (undefined1  [8])&PTR__lazy_ostream_013d3d70;
  local_330 = boost::unit_test::lazy_ostream::inst;
  local_328._M_allocated_capacity = (size_type)&local_7e8;
  local_810 = (int64_t *)0xeee2f8;
  local_808.m_message.px = (element_type *)((ulong)local_808.m_message.px & 0xffffffffffffff00);
  local_808._0_8_ = &PTR__lazy_ostream_013d7790;
  local_808.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_7f0 = &local_810;
  local_7e8 = psVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_7d0,&local_9f0,1,2,REQUIRE,0xeeda98,(size_t)&local_7e0,0x191,local_340,
             "\"2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128\"",&local_808);
  boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&adr.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&adr.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)adr.val._M_dataplus._M_p != &adr.val.field_2) {
    operator_delete(adr.val._M_dataplus._M_p,adr.val.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&o1.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&o1.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)o1.val._M_dataplus._M_p != &o1.val.field_2) {
    operator_delete(o1.val._M_dataplus._M_p,o1.val.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&ar.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ar.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ar.val._M_dataplus._M_p != &ar.val.field_2) {
    operator_delete(ar.val._M_dataplus._M_p,ar.val.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._8_8_ != &local_f0) {
    operator_delete((void *)local_108._8_8_,local_f0._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_ban)
{
    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));

    UniValue r;
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0 add")));
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.0.0:8334")), std::runtime_error); //portnumber for setban not allowed
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    UniValue ar = r.get_array();
    UniValue o1 = ar[0].get_obj();
    UniValue adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/32");
    BOOST_CHECK_NO_THROW(CallRPC(std::string("setban 127.0.0.0 remove")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);

    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/24 add 9907731200 true")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    int64_t banned_until{o1.find_value("banned_until").getInt<int64_t>()};
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/24");
    BOOST_CHECK_EQUAL(banned_until, 9907731200); // absolute time check

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));

    auto now = 10'000s;
    SetMockTime(now);
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/24 add 200")));
    SetMockTime(now += 2s);
    const int64_t time_remaining_expected{198};
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    banned_until = o1.find_value("banned_until").getInt<int64_t>();
    const int64_t ban_created{o1.find_value("ban_created").getInt<int64_t>()};
    const int64_t ban_duration{o1.find_value("ban_duration").getInt<int64_t>()};
    const int64_t time_remaining{o1.find_value("time_remaining").getInt<int64_t>()};
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/24");
    BOOST_CHECK_EQUAL(banned_until, time_remaining_expected + now.count());
    BOOST_CHECK_EQUAL(ban_duration, banned_until - ban_created);
    BOOST_CHECK_EQUAL(time_remaining, time_remaining_expected);

    // must throw an exception because 127.0.0.1 is in already banned subnet range
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.0.1 add")), std::runtime_error);

    BOOST_CHECK_NO_THROW(CallRPC(std::string("setban 127.0.0.0/24 remove")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);

    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/255.255.0.0 add")));
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.1.1 add")), std::runtime_error);

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);


    BOOST_CHECK_THROW(r = CallRPC(std::string("setban test add")), std::runtime_error); //invalid IP

    //IPv6 tests
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban FE80:0000:0000:0000:0202:B3FF:FE1E:8329 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "fe80::202:b3ff:fe1e:8329/128");

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 2001:db8::/ffff:fffc:0:0:0:0:0:0 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "2001:db8::/30");

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128");
}